

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

CSVError * __thiscall
duckdb::CSVError::NullPaddingFail
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          LinesPerBoundary error_info,string *current_path)

{
  LinesPerBoundary error_info_p;
  ostringstream error;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             " The parallel scanner does not support null_padding in conjunction with quoted new lines. Please disable the parallel csv reader with parallel=false"
             ,0x94);
  local_1e8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1e8,1);
  CSVReaderOptions::ToString
            (&local_1e8,(CSVReaderOptions *)this,(string *)error_info.lines_in_batch);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             (char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
             local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
      &local_1e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_));
  }
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = error_info.boundary_idx;
  error_info_p.boundary_idx = (idx_t)options;
  CSVError(__return_storage_ptr__,&local_1c8,NULLPADDED_QUOTED_NEW_VALUE,error_info_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::NullPaddingFail(const CSVReaderOptions &options, LinesPerBoundary error_info,
                                   const string &current_path) {
	std::ostringstream error;
	error << " The parallel scanner does not support null_padding in conjunction with quoted new lines. Please "
	         "disable the parallel csv reader with parallel=false"
	      << '\n';
	// What were the options
	error << options.ToString(current_path);
	return CSVError(error.str(), NULLPADDED_QUOTED_NEW_VALUE, error_info);
}